

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O3

void __thiscall wasm::Precompute::considerPartiallyPrecomputing(Precompute *this,Expression *curr)

{
  Module *wasm;
  bool bVar1;
  __hashtable *__h;
  Expression *pEVar2;
  __node_gen_type __node_gen;
  Select *select;
  
  if (this->canPartiallyPrecompute == true) {
    pEVar2 = (Expression *)0x0;
    if (curr->_id == SelectId) {
      pEVar2 = curr;
    }
    if (pEVar2 != (Expression *)0x0) {
      wasm = (this->
             super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
             ).
             super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
             .
             super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
             .currModule;
      __node_gen._M_h = (__hashtable_alloc *)pEVar2;
      bVar1 = Properties::isValidConstantExpression(wasm,*(Expression **)(pEVar2 + 1));
      if (((bVar1) &&
          (bVar1 = Properties::isValidConstantExpression(wasm,(Expression *)pEVar2[1].type.id),
          bVar1)) &&
         (((this->
           super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
           ).
           super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
           .super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>.
          currFunction)->body != pEVar2)) {
        std::
        _Hashtable<wasm::Select*,wasm::Select*,std::allocator<wasm::Select*>,std::__detail::_Identity,std::equal_to<wasm::Select*>,std::hash<wasm::Select*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<wasm::Select*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Select*,false>>>>
                  ((_Hashtable<wasm::Select*,wasm::Select*,std::allocator<wasm::Select*>,std::__detail::_Identity,std::equal_to<wasm::Select*>,std::hash<wasm::Select*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->partiallyPrecomputable,&__node_gen);
      }
    }
  }
  return;
}

Assistant:

void considerPartiallyPrecomputing(Expression* curr) {
    if (!canPartiallyPrecompute) {
      return;
    }

    if (auto* select = curr->dynCast<Select>()) {
      // We only have a reasonable hope of success if the select arms are things
      // like constants or global gets. At a first approximation, allow the set
      // of things we allow in constant initializers (but we can probably allow
      // more here TODO).
      //
      // We also ignore selects with no parent (that are the entire function
      // body) as then there is nothing to optimize into their arms.
      auto& wasm = *getModule();
      if (Properties::isValidConstantExpression(wasm, select->ifTrue) &&
          Properties::isValidConstantExpression(wasm, select->ifFalse) &&
          getFunction()->body != select) {
        partiallyPrecomputable.insert(select);
      }
    }
  }